

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_gmf.cpp
# Opt level: O1

bool midi_processor::process_gmf
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  ushort uVar1;
  undefined8 uVar2;
  int iVar3;
  uint8_t buffer [10];
  midi_track track;
  const_iterator it;
  undefined8 local_72;
  undefined2 local_6a;
  midi_track local_68;
  midi_event local_50;
  
  midi_container::initialize(p_out,0,0xc0);
  uVar2 = local_72;
  uVar1 = *(ushort *)
           ((p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start + 4);
  iVar3 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8) * 100000;
  local_68.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_72._5_3_ = SUB83(uVar2,5);
  local_72._0_5_ =
       CONCAT14((char)iVar3,
                CONCAT13((char)((uint)iVar3 >> 8),CONCAT12((char)((uint)iVar3 >> 0x10),0x51ff)));
  midi_event::midi_event(&local_50,0,extended,0,(uint8_t *)&local_72,5);
  midi_track::add_event(&local_68,&local_50);
  if (local_50.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_72 = 0x7f12161041f0;
  local_6a = 0xf701;
  midi_event::midi_event(&local_50,0,extended,0,(uint8_t *)&local_72,10);
  midi_track::add_event(&local_68,&local_50);
  if (local_50.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_72 = CONCAT62(local_72._2_6_,0x2fff);
  midi_event::midi_event(&local_50,0,extended,0,(uint8_t *)&local_72,2);
  midi_track::add_event(&local_68,&local_50);
  if (local_50.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  midi_container::add_track(p_out,&local_68);
  local_50.m_timestamp =
       (unsigned_long)
       ((p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start + 7);
  process_standard_midi_track
            ((const_iterator *)&local_50,
             (const_iterator)
             (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,p_out,true);
  std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_68.m_events);
  return true;
}

Assistant:

bool midi_processor::process_gmf( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    uint8_t buffer[10];

    p_out.initialize( 0, 0xC0 );

    uint16_t tempo = ( p_file[ 4 ] << 8 ) | p_file[ 5 ];
    uint32_t tempo_scaled = tempo * 100000;

    midi_track track;

    buffer[0] = 0xFF;
    buffer[1] = 0x51;
    buffer[2] = tempo_scaled >> 16;
    buffer[3] = tempo_scaled >> 8;
    buffer[4] = tempo_scaled;

    track.add_event( midi_event( 0, midi_event::extended, 0, buffer, 5 ) );

    buffer[0] = 0xF0;
    buffer[1] = 0x41;
    buffer[2] = 0x10;
    buffer[3] = 0x16;
    buffer[4] = 0x12;
    buffer[5] = 0x7F;
    buffer[6] = 0x00;
    buffer[7] = 0x00;
    buffer[8] = 0x01;
    buffer[9] = 0xF7;

    track.add_event( midi_event( 0, midi_event::extended, 0, buffer, 10 ) );

    buffer[0] = 0xFF;
    buffer[1] = 0x2F;

    track.add_event( midi_event( 0, midi_event::extended, 0, buffer, 2 ) );

    p_out.add_track( track );

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 7;

    process_standard_midi_track( it, p_file.end(), p_out, true );
    
    return true;
}